

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O1

wchar_t rar5_read_data_skip(archive_read *a)

{
  void *pvVar1;
  long lVar2;
  wchar_t wVar3;
  int64_t iVar5;
  archive_format_descriptor *paVar4;
  
  paVar4 = a->format;
  pvVar1 = paVar4->data;
  if (((*(byte *)((long)pvVar1 + 0x2c) & 1) == 0) || ((*(byte *)((long)pvVar1 + 0x38) & 0x10) != 0))
  {
    lVar2 = *(long *)((long)pvVar1 + 0x4ba8);
    iVar5 = __archive_read_consume(a,lVar2);
    if (iVar5 != lVar2) {
      return L'\xffffffe2';
    }
    *(undefined8 *)((long)pvVar1 + 0x4ba8) = 0;
  }
  else {
    while( true ) {
      wVar3 = (wchar_t)paVar4;
      lVar2 = *(long *)((long)pvVar1 + 0x4ba8);
      if (lVar2 < 1) break;
      *(int *)((long)pvVar1 + 8) = *(int *)((long)pvVar1 + 8) + 1;
      wVar3 = rar5_read_data(a,(void **)0x0,(size_t *)0x0,(int64_t *)0x0);
      paVar4 = (archive_format_descriptor *)(ulong)(uint)wVar3;
      *(int *)((long)pvVar1 + 8) = *(int *)((long)pvVar1 + 8) + -1;
      if ((wVar3 < L'\0') || (wVar3 == L'\x01')) break;
    }
    if (0 < lVar2) {
      return wVar3;
    }
  }
  return L'\0';
}

Assistant:

static int rar5_read_data_skip(struct archive_read *a) {
	struct rar5* rar = get_context(a);

	if(rar->main.solid && (rar->cstate.data_encrypted == 0)) {
		/* In solid archives, instead of skipping the data, we need to
		 * extract it, and dispose the result. The side effect of this
		 * operation will be setting up the initial window buffer state
		 * needed to be able to extract the selected file. Note that
		 * this is only possible when data withing this solid block is
		 * not encrypted, in which case we'll skip and fail if the user
		 * tries to read data. */

		int ret;

		/* Make sure to process all blocks in the compressed stream. */
		while(rar->file.bytes_remaining > 0) {
			/* Setting the "skip mode" will allow us to skip
			 * checksum checks during data skipping. Checking the
			 * checksum of skipped data isn't really necessary and
			 * it's only slowing things down.
			 *
			 * This is incremented instead of setting to 1 because
			 * this data skipping function can be called
			 * recursively. */
			rar->skip_mode++;

			/* We're disposing 1 block of data, so we use triple
			 * NULLs in arguments. */
			ret = rar5_read_data(a, NULL, NULL, NULL);

			/* Turn off "skip mode". */
			rar->skip_mode--;

			if(ret < 0 || ret == ARCHIVE_EOF) {
				/* Propagate any potential error conditions
				 * to the caller. */
				return ret;
			}
		}
	} else {
		/* In standard archives, we can just jump over the compressed
		 * stream. Each file in non-solid archives starts from an empty
		 * window buffer. */

		if(ARCHIVE_OK != consume(a, rar->file.bytes_remaining)) {
			return ARCHIVE_FATAL;
		}

		rar->file.bytes_remaining = 0;
	}

	return ARCHIVE_OK;
}